

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::Add<Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *this,int propertyIndex,
          PropertyRecord *propertyKey,PropertyAttributes attributes,bool isInitialized,bool isFixed,
          bool usedAsFixed,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
  *this_00;
  code *pcVar2;
  PropertyAttributes attributes_00;
  bool bVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000009;
  SimpleDictionaryPropertyDescriptor<int> local_50;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_48;
  undefined4 local_3c;
  DynamicTypeHandler *local_38;
  
  if (propertyKey != (PropertyRecord *)0x0) {
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    local_3c = (undefined4)CONCAT71(in_register_00000009,attributes);
    local_50.Attributes = attributes;
    local_50.propertyIndex = propertyIndex;
    if ((isFixed || usedAsFixed) &&
       (((uint)propertyKey->pid < 0x10 || (*(long *)(this + 0x20) == 0)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      local_38 = (DynamicTypeHandler *)__tls_get_addr(&PTR_013e5f18);
      *(undefined4 *)&local_38->_vptr_DynamicTypeHandler = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41c,
                                  "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                  ,
                                  "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                 );
      if (!bVar3) goto LAB_00cb6e65;
      *(undefined4 *)&local_38->_vptr_DynamicTypeHandler = 0;
    }
    if (((uint)propertyKey->pid < 0x10) || (propertyKey->isSymbol == true)) {
      AssertCount = AssertCount + 1;
      local_38 = (DynamicTypeHandler *)this;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41f,"(!TMapKey_IsJavascriptString<TMapKey>())",
                                  "!TMapKey_IsJavascriptString<TMapKey>()");
      if (!bVar3) {
LAB_00cb6e65:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      *(byte *)&local_38[1].unusedBytes = (byte)local_38[1].unusedBytes | 4;
      this = (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)local_38;
    }
    local_50._0_1_ = (usedAsFixed << 3 | isFixed << 2 | isInitialized * '\x02') + 1;
    this_00 = (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
               *)((DynamicTypeHandler *)((long)this + 0x18))->_vptr_DynamicTypeHandler;
    local_48.ptr = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
                   TMapKey_ConvertKey<Js::JavascriptString*>(scriptContext,propertyKey);
    JsUtil::
    BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
              (this_00,(JavascriptString **)&local_48,&local_50);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&local_48,&pJVar1->typesWithNoSpecialPropertyProtoChain);
    attributes_00 = (PropertyAttributes)local_3c;
    PrototypeChainCache<Js::NoSpecialPropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
              (local_48.ptr,(DynamicTypeHandler *)this,(PropertyAttributes)local_3c,propertyKey,
               scriptContext);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                    &local_48,&pJVar1->typesWithOnlyWritablePropertyProtoChain);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<Js::PropertyRecord_const*>
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_48.ptr,
               (DynamicTypeHandler *)this,attributes_00,propertyKey,scriptContext);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }